

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

json_t * do_deep_copy(json_t *json,hashtable_t *parents)

{
  int iVar1;
  void *iter;
  char *key;
  json_t *pjVar2;
  json_t *pjVar3;
  ulong uVar4;
  json_array_t *array;
  size_t local_50;
  char loop_key [19];
  
  if (json == (json_t *)0x0) {
switchD_00114e77_default:
    json = (json_t *)0x0;
  }
  else {
    switch(json->type) {
    case JSON_OBJECT:
      iVar1 = jsonp_loop_check(parents,json,loop_key,0x13,&local_50);
      if (iVar1 == 0) {
        pjVar2 = json_object();
        if (pjVar2 != (json_t *)0x0) {
          for (iter = json_object_iter(json); iter != (void *)0x0;
              iter = json_object_iter_next(json,iter)) {
            key = (char *)hashtable_iter_key(iter);
            pjVar3 = (json_t *)hashtable_iter_value(iter);
            pjVar3 = do_deep_copy(pjVar3,parents);
            iVar1 = json_object_set_new_nocheck(pjVar2,key,pjVar3);
            if (iVar1 != 0) goto LAB_00114fa8;
          }
          goto LAB_00114fb3;
        }
LAB_00114fb0:
        pjVar2 = (json_t *)0x0;
LAB_00114fb3:
        hashtable_del(parents,loop_key,local_50);
        return pjVar2;
      }
      break;
    case JSON_ARRAY:
      iVar1 = jsonp_loop_check(parents,json,loop_key,0x13,&local_50);
      if (iVar1 == 0) {
        pjVar2 = json_array();
        if (pjVar2 != (json_t *)0x0) {
          uVar4 = 0;
          do {
            if ((json->type != JSON_ARRAY) || (*(ulong *)(json + 4) <= uVar4)) goto LAB_00114fb3;
            pjVar3 = do_deep_copy(*(json_t **)(*(long *)(json + 6) + uVar4 * 8),parents);
            iVar1 = json_array_append_new(pjVar2,pjVar3);
            uVar4 = uVar4 + 1;
          } while (iVar1 == 0);
LAB_00114fa8:
          json_delete(pjVar2);
        }
        goto LAB_00114fb0;
      }
      break;
    case JSON_STRING:
      pjVar2 = json_string_copy(json);
      return pjVar2;
    case JSON_INTEGER:
      pjVar2 = json_integer_copy(json);
      return pjVar2;
    case JSON_REAL:
      pjVar2 = json_real_copy(json);
      return pjVar2;
    case JSON_TRUE:
    case JSON_FALSE:
    case JSON_NULL:
      goto switchD_00114e77_caseD_5;
    default:
      goto switchD_00114e77_default;
    }
    json = (json_t *)0x0;
  }
switchD_00114e77_caseD_5:
  return json;
}

Assistant:

json_t *do_deep_copy(const json_t *json, hashtable_t *parents) {
    if (!json)
        return NULL;

    switch (json_typeof(json)) {
        case JSON_OBJECT:
            return json_object_deep_copy(json, parents);
        case JSON_ARRAY:
            return json_array_deep_copy(json, parents);
            /* for the rest of the types, deep copying doesn't differ from
               shallow copying */
        case JSON_STRING:
            return json_string_copy(json);
        case JSON_INTEGER:
            return json_integer_copy(json);
        case JSON_REAL:
            return json_real_copy(json);
        case JSON_TRUE:
        case JSON_FALSE:
        case JSON_NULL:
            return (json_t *) json;
        default:
            return NULL;
    }
}